

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O0

bool notExist(btVector3 *planeEquation,btAlignedObjectArray<btVector3> *planeEquations)

{
  int iVar1;
  btVector3 *v;
  btAlignedObjectArray<btVector3> *in_RSI;
  btVector3 *in_RDI;
  btScalar bVar2;
  btVector3 *N1;
  int i;
  int numbrushes;
  int local_20;
  
  iVar1 = btAlignedObjectArray<btVector3>::size(in_RSI);
  local_20 = 0;
  while( true ) {
    if (iVar1 <= local_20) {
      return true;
    }
    v = btAlignedObjectArray<btVector3>::operator[](in_RSI,local_20);
    bVar2 = btVector3::dot(in_RDI,v);
    if (0.999 < bVar2) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool notExist(const btVector3& planeEquation,const btAlignedObjectArray<btVector3>& planeEquations)
{
	int numbrushes = planeEquations.size();
	for (int i=0;i<numbrushes;i++)
	{
		const btVector3& N1 = planeEquations[i];
		if (planeEquation.dot(N1) > btScalar(0.999))
		{
			return false;
		} 
	}
	return true;
}